

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

void __thiscall xmrig::Client::setState(Client *this,SocketState state)

{
  long lVar1;
  uint64_t uVar2;
  
  if ((this->super_BaseClient).m_state == state) {
    return;
  }
  if (state == HostLookupState) {
    uVar2 = 0;
  }
  else if (state == ReconnectingState) {
    lVar1 = std::chrono::_V2::steady_clock::now();
    uVar2 = lVar1 / 1000000 + (this->super_BaseClient).m_retryPause;
  }
  else {
    if (state != ConnectingState) goto LAB_001495db;
    lVar1 = std::chrono::_V2::steady_clock::now();
    uVar2 = lVar1 / 1000000 + 20000;
  }
  this->m_expire = uVar2;
LAB_001495db:
  (this->super_BaseClient).m_state = state;
  return;
}

Assistant:

void xmrig::Client::setState(SocketState state)
{
    LOG_DEBUG("[%s] state: \"%s\"", url(), states[state]);

    if (m_state == state) {
        return;
    }

    switch (state) {
    case HostLookupState:
        m_expire = 0;
        break;

    case ConnectingState:
        m_expire = Chrono::steadyMSecs() + kConnectTimeout;
        break;

    case ReconnectingState:
        m_expire = Chrono::steadyMSecs() + m_retryPause;
        break;

    default:
        break;
    }

    m_state = state;
}